

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qual_hostname.c
# Opt level: O0

int get_self_ip_addr(void *cm,CMtrans_services_conflict svc)

{
  code *pcVar1;
  undefined8 uVar2;
  uint32_t *puVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint __af;
  uint32_t uVar6;
  int iVar7;
  char *pcVar8;
  long in_RSI;
  undefined8 in_RDI;
  char *c;
  in_addr *in_1;
  uint32_t ret_ip;
  int family_2;
  in_addr *in;
  int family_1;
  int family;
  char *interface;
  int rv;
  int ipv6_count;
  int ipv4_count;
  int ss;
  int ifrn;
  ifconf ifaces;
  sockaddr_in *sai;
  ifreq *ifr;
  char *ifreqs;
  char buf [46];
  void *tmp;
  ifaddrs *if_addr;
  ifaddrs *if_addrs;
  char **p;
  char hostname_buf [256];
  hostent *host;
  undefined8 in_stack_fffffffffffffd80;
  undefined8 uVar9;
  uint32_t local_1b4;
  int local_1a4;
  int local_1a0 [2];
  void *local_198;
  long local_190;
  void *local_188;
  void *local_180;
  char local_178 [48];
  uint32_t *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  char **local_130;
  char local_128 [264];
  hostent *local_20;
  long local_18;
  undefined8 local_10;
  
  local_138 = (undefined8 *)0x0;
  local_140 = (undefined8 *)0x0;
  local_148 = (uint32_t *)0x0;
  local_1b4 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar5 = getifaddrs(&local_138);
  if (iVar5 == 0) {
    for (local_140 = local_138; uVar9 = local_10, local_140 != (undefined8 *)0x0;
        local_140 = (undefined8 *)*local_140) {
      if ((local_140[3] != 0) && ((__af = (uint)*(ushort *)local_140[3], __af == 2 || (__af == 10)))
         ) {
        if (*(short *)local_140[3] == 2) {
          local_148 = (uint32_t *)(local_140[3] + 4);
        }
        else {
          local_148 = (uint32_t *)(local_140[3] + 8);
        }
        if (local_18 != 0) {
          pcVar1 = *(code **)(local_18 + 0x30);
          uVar2 = local_140[1];
          pcVar8 = inet_ntop(__af,local_148,local_178,0x2e);
          (*pcVar1)(uVar9,"CM<transport> IP possibility -> %s : %s",uVar2,pcVar8);
        }
      }
    }
    pcVar8 = getenv("CM_INTERFACE");
    if (pcVar8 != (char *)0x0) {
      for (local_140 = local_138; local_140 != (undefined8 *)0x0;
          local_140 = (undefined8 *)*local_140) {
        if (((local_140[3] != 0) && (*(short *)local_140[3] == 2)) &&
           (iVar5 = strcmp((char *)local_140[1],pcVar8), iVar5 == 0)) {
          local_148 = (uint32_t *)(local_140[3] + 4);
          if (local_18 != 0) {
            pcVar1 = *(code **)(local_18 + 0x30);
            uVar9 = local_140[1];
            pcVar8 = inet_ntop(2,local_148,local_178,0x2e);
            (*pcVar1)(local_10,"CM<transport> Interface specified, returning ->%s : %s",uVar9,pcVar8
                     );
          }
          freeifaddrs(local_138);
          uVar6 = ntohl(*local_148);
          return uVar6;
        }
      }
      printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n"
             ,pcVar8);
    }
    gethostname(local_128,0x100);
    local_20 = gethostbyname(local_128);
    if (local_20 != (hostent *)0x0) {
      for (local_130 = local_20->h_addr_list; *local_130 != (char *)0x0; local_130 = local_130 + 1)
      {
        puVar3 = (uint32_t *)*local_130;
        ntohl(*puVar3);
        iVar5 = ipv4_is_loopback((int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        if (iVar5 == 0) {
          if (local_18 != 0) {
            (**(code **)(local_18 + 0x30))
                      (local_10,
                       "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
                       (char)*puVar3,*(undefined1 *)((long)puVar3 + 1),
                       *(undefined1 *)((long)puVar3 + 2),*(undefined1 *)((long)puVar3 + 3));
          }
          freeifaddrs(local_138);
          uVar6 = ntohl(*puVar3);
          return uVar6;
        }
      }
    }
    for (local_140 = local_138; local_140 != (undefined8 *)0x0; local_140 = (undefined8 *)*local_140
        ) {
      if (((local_140[3] != 0) && (*(short *)local_140[3] == 2)) &&
         ((*(uint *)(local_140 + 2) & 8) == 0)) {
        local_148 = (uint32_t *)(local_140[3] + 4);
        if (local_18 != 0) {
          pcVar1 = *(code **)(local_18 + 0x30);
          uVar9 = local_140[1];
          pcVar8 = inet_ntop(2,local_148,local_178,0x2e);
          (*pcVar1)(local_10,"CM<transport> get_self_ip_addr returning first avail -> %s : %s",uVar9
                    ,pcVar8);
        }
        uVar6 = ntohl(*local_148);
        freeifaddrs(local_138);
        return uVar6;
      }
    }
  }
  if (local_138 != (undefined8 *)0x0) {
    freeifaddrs(local_138);
  }
  gethostname(local_128,0x100);
  local_20 = gethostbyname(local_128);
  if (local_20 != (hostent *)0x0) {
    for (local_130 = local_20->h_addr_list; *local_130 != (char *)0x0; local_130 = local_130 + 1) {
      puVar3 = (uint32_t *)*local_130;
      ntohl(*puVar3);
      iVar5 = ipv4_is_loopback((int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      if (iVar5 == 0) {
        if (local_18 != 0) {
          pcVar1 = *(code **)(local_18 + 0x30);
          uVar6 = ntohl(*puVar3);
          (*pcVar1)(local_10,"CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",uVar6,
                    (char)*puVar3,*(undefined1 *)((long)puVar3 + 1),
                    *(undefined1 *)((long)puVar3 + 2),*(undefined1 *)((long)puVar3 + 3));
        }
        uVar6 = ntohl(*puVar3);
        return uVar6;
      }
    }
  }
  iVar5 = socket(2,2,0);
  local_1a0[0] = 0xa00;
  local_198 = malloc(0xa00);
  local_180 = local_198;
  iVar7 = ioctl(iVar5,0x8912,local_1a0);
  if (-1 < iVar7) {
    local_188 = local_198;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)local_1a0[0];
    local_1a4 = SUB164(auVar4 / ZEXT816(0x28),0);
    while (local_1a4 != 0) {
      ioctl(iVar5,0x8913,local_188);
      uVar9 = local_10;
      local_190 = (long)local_188 + 0x10;
      if ((*(ushort *)((long)local_188 + 0x10) & 8) == 0) {
        if ((*(ushort *)((long)local_188 + 0x10) & 1) == 0) {
          if (local_18 != 0) {
            pcVar1 = *(code **)(local_18 + 0x30);
            uVar6 = ntohl(*(uint32_t *)((long)local_188 + 0x14));
            (*pcVar1)(uVar9,"CM<transport> - Get self IP addr %lx, rejected, not UP",uVar6);
          }
        }
        else if ((*(ushort *)((long)local_188 + 0x10) & 0x40) == 0) {
          if (local_18 != 0) {
            pcVar1 = *(code **)(local_18 + 0x30);
            uVar6 = ntohl(*(uint32_t *)((long)local_188 + 0x14));
            (*pcVar1)(uVar9,"CM<transport> - Get self IP addr %lx, rejected, not RUNNING",uVar6);
          }
        }
        else if ((*(int *)((long)local_188 + 0x14) != 0) &&
                (*(int *)((long)local_188 + 0x14) != 0x7f000001)) {
          local_1b4 = ntohl(*(uint32_t *)((long)local_188 + 0x14));
          if (local_18 != 0) {
            pcVar1 = *(code **)(local_18 + 0x30);
            uVar9 = local_10;
            uVar6 = ntohl(*(uint32_t *)(local_190 + 4));
            (*pcVar1)(uVar9,"CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",uVar6,
                      *(undefined1 *)(local_190 + 4),*(undefined1 *)(local_190 + 5),
                      *(undefined1 *)(local_190 + 6),*(undefined1 *)(local_190 + 7));
          }
          break;
        }
      }
      else if (local_18 != 0) {
        pcVar1 = *(code **)(local_18 + 0x30);
        uVar6 = ntohl(*(uint32_t *)((long)local_188 + 0x14));
        (*pcVar1)(uVar9,"CM<transport> - Get self IP addr %lx, rejected, loopback",uVar6);
      }
      local_188 = (void *)((long)local_188 + 0x28);
      local_1a4 = local_1a4 + -1;
    }
  }
  close(iVar5);
  free(local_180);
  if (local_1b4 == 0) {
    pcVar8 = getenv("CM_LAST_RESORT_IP_ADDR");
    if (local_18 != 0) {
      (**(code **)(local_18 + 0x30))(local_10,"CM<transport> - Get self IP addr at last resort");
    }
    if (pcVar8 != (char *)0x0) {
      if (local_18 != 0) {
        (**(code **)(local_18 + 0x30))(local_10,"CM<transport> - Translating last resort %s",pcVar8)
        ;
      }
      local_1b4 = inet_addr(pcVar8);
    }
  }
  return local_1b4;
}

Assistant:

static int
get_self_ip_addr(void *cm, CMtrans_services svc)
{
    struct hostent *host;
    char hostname_buf[256];
    char **p;
#ifdef HAVE_GETIFADDRS
  struct ifaddrs *if_addrs = NULL;
  struct ifaddrs *if_addr = NULL;
  void *tmp = NULL;
  char buf[INET6_ADDRSTRLEN];
#endif
#ifdef SIOCGIFCONF
    char *ifreqs;
    struct ifreq *ifr;
    struct sockaddr_in *sai;
    struct ifconf ifaces;
    int ifrn;
    int ss;
    int ipv4_count = 0;
    int ipv6_count = 0;
#endif
    int rv = 0;
#ifdef HAVE_GETIFADDRS
    if (getifaddrs(&if_addrs) == 0) {    
        char *interface;
	// Print possible addresses
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if ((family != AF_INET) && (family != AF_INET6)) continue;
	    if (if_addr->ifa_addr->sa_family == AF_INET) {
	        tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		ipv4_count++;
	    } else {
	        tmp = &((struct sockaddr_in6 *)if_addr->ifa_addr)->sin6_addr;
		ipv6_count++;
	    }
	    if (svc) {
	        svc->trace_out(cm, "CM<transport> IP possibility -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	}
	if ((interface = getenv("CM_INTERFACE")) != NULL) {
	    for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	        int family;
	        if (!if_addr->ifa_addr) continue;
		family = if_addr->ifa_addr->sa_family;
		if (family != AF_INET) continue;  /* currently not looking for ipv6 */
		if (strcmp(if_addr->ifa_name, interface) != 0) continue;
		tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		if (svc) {
		    svc->trace_out(cm, "CM<transport> Interface specified, returning ->%s : %s",
				   if_addr->ifa_name,
				   inet_ntop(family, tmp, buf, sizeof(buf)));
		}
		freeifaddrs(if_addrs);
		return (ntohl(*(uint32_t*)tmp));
	    }
	    printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n", interface);
	}
	    
	gethostname(hostname_buf, sizeof(hostname_buf));
	host = gethostbyname(hostname_buf);
	if (host != NULL) {
	    for (p = host->h_addr_list; *p != 0; p++) {
		struct in_addr *in = *(struct in_addr **) p;
		if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		    if (svc)
			svc->trace_out(cm, "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
				       *((unsigned char *) &in->s_addr),
				       *(((unsigned char *) &in->s_addr) + 1),
				       *(((unsigned char *) &in->s_addr) + 2),
				       *(((unsigned char *) &in->s_addr) + 3));
		    freeifaddrs(if_addrs);
		    return (ntohl(in->s_addr));
		}
	    }
	}
	/* choose the first thing that's not a loopback interface */
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    uint32_t ret_ip;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if (family != AF_INET) continue;  /* currently not looking for ipv6 */
	    if ((if_addr->ifa_flags & IFF_LOOPBACK) != 0)  continue;
	    tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
	    if (svc) {
		svc->trace_out(cm, "CM<transport> get_self_ip_addr returning first avail -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	    ret_ip = (ntohl(*(uint32_t*)tmp));
	    freeifaddrs(if_addrs);
	    return ret_ip;
	}
    }
    if (if_addrs) freeifaddrs(if_addrs);
#endif	
    gethostname(hostname_buf, sizeof(hostname_buf));
    host = gethostbyname(hostname_buf);
    if (host != NULL) {
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",
				   ntohl(in->s_addr),
				   *((unsigned char *) &in->s_addr),
				   *(((unsigned char *) &in->s_addr) + 1),
				   *(((unsigned char *) &in->s_addr) + 2),
				   *(((unsigned char *) &in->s_addr) + 3));
		return (ntohl(in->s_addr));
	    }
	}
    }
    /*
     *  Since we couldn't find an IP address in some logical way, we'll open
     *  a DGRAM socket and ask it first for the list of its interfaces, and
     *  then checking for an interface we can use, and then finally asking that
     *  interface what its address is.
     */
#ifdef SIOCGIFCONF
    ss = socket(AF_INET, SOCK_DGRAM, 0);
    ifaces.ifc_len = 64 * sizeof(struct ifreq);
    ifaces.ifc_buf = ifreqs = malloc(ifaces.ifc_len);
    /*
     *  if we can't SIOCGIFCONF we're kind of dead anyway, bail.
     */
    if (ioctl(ss, SIOCGIFCONF, &ifaces) >= 0) {
	ifr = ifaces.ifc_req;
	ifrn = ifaces.ifc_len / sizeof(struct ifreq);
	for (; ifrn--; ifr++) {
	    /*
	     * Basically we'll take the first interface satisfying 
	     * the following: 
	     *   up, running, not loopback, address family is INET.
	     */
	    ioctl(ss, SIOCGIFFLAGS, ifr);
	    sai = (struct sockaddr_in *) &(ifr->ifr_addr);
	    if (ifr->ifr_flags & IFF_LOOPBACK) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, loopback",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_UP)) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, not UP",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_RUNNING)) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, not RUNNING",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    /*
	     * sure would be nice to test for AF_INET here but it doesn't
	     * cooperate and I've done enough for now ...
	     * if (sai->sin_addr.s.addr != AF_INET) continue;
	    */
	    if (sai->sin_addr.s_addr == INADDR_ANY)
		continue;
	    if (sai->sin_addr.s_addr == INADDR_LOOPBACK)
		continue;
	    rv = ntohl(sai->sin_addr.s_addr);
	    if (svc)
		svc->trace_out(cm, "CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",
			       ntohl(sai->sin_addr.s_addr),
			       *((unsigned char *) &sai->sin_addr.s_addr),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 1),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 2),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 3));
	    break;
	}
    }
    close(ss);
    free(ifreqs);
#endif
    /*
     *  Absolute last resort.  If we can't figure out anything else, look
     *  for the CM_LAST_RESORT_IP_ADDR environment variable.
     */
    if (rv == 0) {
	char *c = getenv("CM_LAST_RESORT_IP_ADDR");
	if (svc)
	    svc->trace_out(cm, "CM<transport> - Get self IP addr at last resort");
	if (c != NULL) {
	    if (svc)
		svc->trace_out(cm, "CM<transport> - Translating last resort %s", c);
	    rv = inet_addr(c);
	}
    }
    /*
     *	hopefully by now we've set rv to something useful.  If not,
     *  GET A BETTER NETWORK CONFIGURATION.
     */
    return rv;
}